

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_lib.c
# Opt level: O0

void libdef_push(BuildCtx *ctx,char *p,int arg)

{
  uint8_t *puVar1;
  int iVar2;
  size_t sVar3;
  double local_30;
  double d;
  char *ep;
  int len;
  int arg_local;
  char *p_local;
  BuildCtx *ctx_local;
  
  if (ctx->mode == BUILD_libdef) {
    ep._4_4_ = arg;
    _len = p;
    p_local = (char *)ctx;
    sVar3 = strlen(p);
    ep._0_4_ = (int)sVar3;
    if (*_len == '\"') {
      if (((int)ep < 2) || (_len[(int)ep + -1] != '\"')) {
LAB_0010e911:
        fprintf(_stderr,"Error: bad value for %sPUSH(%s)\n","LJLIB_",_len);
        exit(1);
      }
      _len[(int)ep + -1] = '\0';
      libdef_name(_len + 1,0xc0);
    }
    else if ((*_len < '0') || ('9' < *_len)) {
      iVar2 = strcmp(_len,"lastcl");
      if (iVar2 == 0) {
        if (&optr < optr + 1) {
          fprintf(_stderr,"Error: output buffer overflow\n");
          exit(1);
        }
        puVar1 = optr + 1;
        *optr = 0xfd;
        optr = puVar1;
      }
      else {
        if (((int)ep < 5) || (iVar2 = strncmp(_len,"top-",4), iVar2 != 0)) goto LAB_0010e911;
        if (&optr < optr + 2) {
          fprintf(_stderr,"Error: output buffer overflow\n");
          exit(1);
        }
        puVar1 = optr + 1;
        *optr = 0xfc;
        optr = puVar1;
        iVar2 = atoi(_len + 4);
        puVar1 = optr + 1;
        *optr = (uint8_t)iVar2;
        optr = puVar1;
      }
    }
    else {
      local_30 = strtod(_len,(char **)&d);
      if (*(char *)d != '\0') goto LAB_0010e911;
      if (&optr < optr + 9) {
        fprintf(_stderr,"Error: output buffer overflow\n");
        exit(1);
      }
      puVar1 = optr + 1;
      *optr = 0xfb;
      optr = puVar1;
      memcpy_endian(optr,&local_30,8);
      optr = optr + 8;
    }
  }
  return;
}

Assistant:

static void libdef_push(BuildCtx *ctx, char *p, int arg)
{
  UNUSED(arg);
  if (ctx->mode == BUILD_libdef) {
    int len = (int)strlen(p);
    if (*p == '"') {
      if (len > 1 && p[len-1] == '"') {
	p[len-1] = '\0';
	libdef_name(p+1, LIBINIT_STRING);
	return;
      }
    } else if (*p >= '0' && *p <= '9') {
      char *ep;
      double d = strtod(p, &ep);
      if (*ep == '\0') {
	if (optr+1+sizeof(double) > obuf+sizeof(obuf)) {
	  fprintf(stderr, "Error: output buffer overflow\n");
	  exit(1);
	}
	*optr++ = LIBINIT_NUMBER;
	memcpy_endian(optr, &d, sizeof(double));
	optr += sizeof(double);
	return;
      }
    } else if (!strcmp(p, "lastcl")) {
      if (optr+1 > obuf+sizeof(obuf)) {
	fprintf(stderr, "Error: output buffer overflow\n");
	exit(1);
      }
      *optr++ = LIBINIT_LASTCL;
      return;
    } else if (len > 4 && !strncmp(p, "top-", 4)) {
      if (optr+2 > obuf+sizeof(obuf)) {
	fprintf(stderr, "Error: output buffer overflow\n");
	exit(1);
      }
      *optr++ = LIBINIT_COPY;
      *optr++ = (uint8_t)atoi(p+4);
      return;
    }
    fprintf(stderr, "Error: bad value for %sPUSH(%s)\n", LIBDEF_PREFIX, p);
    exit(1);
  }
}